

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

ImFont * __thiscall
ImFontAtlas::AddFontFromMemoryCompressedTTF
          (ImFontAtlas *this,void *compressed_ttf_data,int compressed_ttf_size,float size_pixels,
          ImFontConfig *font_cfg_template,ImWchar *glyph_ranges)

{
  byte bVar1;
  uint uVar2;
  uchar *puVar3;
  ImFont *pIVar4;
  uchar *puVar5;
  ushort *puVar6;
  uint uVar7;
  ushort *puVar8;
  ulong uVar9;
  uint uVar10;
  undefined7 local_160;
  float fStack_159;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  ImWchar *pIStack_120;
  float local_118;
  char local_108 [48];
  undefined2 local_d8;
  ImFontConfig local_d0;
  float local_48;
  
  uVar2 = *(uint *)((long)compressed_ttf_data + 8);
  uVar10 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  local_48 = size_pixels;
  puVar3 = (uchar *)ImGui::MemAlloc((ulong)uVar10);
  uVar2 = *compressed_ttf_data;
  if (((uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18) ==
       0x57bc0000) &&
     (uVar2 = *(uint *)((long)compressed_ttf_data + 4),
     ((uVar2 >> 0x18 == 0 && (uVar2 & 0xff0000) == 0) && (uVar2 & 0xff00) == 0) &&
     (uVar2 & 0xff) == 0)) {
    uVar2 = *(uint *)((long)compressed_ttf_data + 8);
    puVar8 = (ushort *)((long)compressed_ttf_data + 0x10);
    stb__barrier_in_b = (uchar *)compressed_ttf_data;
    stb__barrier_out_e =
         puVar3 + (uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18);
    stb__barrier_out_b = puVar3;
    stb__dout = puVar3;
    do {
      bVar1 = (byte)*puVar8;
      uVar7 = (uint)bVar1;
      if (bVar1 < 0x20) {
        if (bVar1 < 0x18) {
          if (bVar1 < 0x10) {
            if (bVar1 < 8) {
              if (bVar1 == 4) {
                stb__match(stb__dout +
                           ~((ulong)*(byte *)((long)puVar8 + 3) |
                             (ulong)*(byte *)((long)puVar8 + 1) << 0x10 |
                            (ulong)(byte)puVar8[1] << 8),
                           (ushort)(puVar8[2] << 8 | puVar8[2] >> 8) + 1);
                puVar6 = puVar8 + 3;
              }
              else {
                if (uVar7 == 6) {
                  uVar9 = ~((ulong)*(byte *)((long)puVar8 + 3) |
                            (ulong)*(byte *)((long)puVar8 + 1) << 0x10 | (ulong)(byte)puVar8[1] << 8
                           );
                  uVar7 = (uint)(byte)puVar8[2];
                  goto LAB_0012e854;
                }
                puVar6 = puVar8;
                if (uVar7 == 7) {
                  uVar9 = (ulong)(ushort)(*(ushort *)((long)puVar8 + 1) << 8 |
                                         *(ushort *)((long)puVar8 + 1) >> 8);
                  puVar5 = stb__dout + uVar9 + 1;
                  if (puVar5 <= stb__barrier_out_e) {
                    if ((byte *)((long)puVar8 + 3) < stb__barrier_in_b) {
                      puVar5 = stb__barrier_out_e + 1;
                    }
                    else {
                      memcpy(stb__dout,(byte *)((long)puVar8 + 3),uVar9 + 1);
                    }
                  }
                  puVar6 = (ushort *)
                           ((long)puVar8 +
                           (ulong)(ushort)(*(ushort *)((long)puVar8 + 1) << 8 |
                                          *(ushort *)((long)puVar8 + 1) >> 8) + 4);
                  stb__dout = puVar5;
                }
              }
            }
            else {
              uVar9 = (ulong)(((uint)bVar1 * 0x100 + (uint)*(byte *)((long)puVar8 + 1)) - 0x7ff);
              puVar5 = stb__dout + uVar9;
              if (puVar5 <= stb__barrier_out_e) {
                if (puVar8 + 1 < stb__barrier_in_b) {
                  puVar5 = stb__barrier_out_e + 1;
                }
                else {
                  memcpy(stb__dout,puVar8 + 1,uVar9);
                }
              }
              puVar6 = (ushort *)
                       ((long)puVar8 + ((ulong)(ushort)(*puVar8 << 8 | *puVar8 >> 8) - 0x7fd));
              stb__dout = puVar5;
            }
          }
          else {
            uVar9 = -(ulong)(((uint)*(byte *)((long)puVar8 + 1) * 0x100 +
                             ((uint)(byte)puVar8[1] | (uint)bVar1 << 0x10)) - 0xfffff);
            uVar7 = (uint)(ushort)(*(ushort *)((long)puVar8 + 3) << 8 |
                                  *(ushort *)((long)puVar8 + 3) >> 8);
LAB_0012e854:
            stb__match(stb__dout + uVar9,uVar7 + 1);
            puVar6 = (ushort *)((long)puVar8 + 5);
          }
        }
        else {
          stb__match(stb__dout +
                     -(ulong)(((uint)*(byte *)((long)puVar8 + 1) * 0x100 +
                              ((uint)(byte)puVar8[1] | (uint)bVar1 << 0x10)) - 0x17ffff),
                     *(byte *)((long)puVar8 + 3) + 1);
          puVar6 = puVar8 + 2;
        }
      }
      else if ((char)bVar1 < '\0') {
        stb__match(stb__dout + ~(ulong)*(byte *)((long)puVar8 + 1),uVar7 - 0x7f);
        puVar6 = puVar8 + 1;
      }
      else if (bVar1 < 0x40) {
        puVar5 = stb__dout + (uVar7 - 0x1f);
        if (puVar5 <= stb__barrier_out_e) {
          if ((byte *)((long)puVar8 + 1) < stb__barrier_in_b) {
            puVar5 = stb__barrier_out_e + 1;
          }
          else {
            memcpy(stb__dout,(byte *)((long)puVar8 + 1),(ulong)(uVar7 - 0x1f));
          }
        }
        puVar6 = (ushort *)((long)puVar8 + ((ulong)(byte)*puVar8 - 0x1e));
        stb__dout = puVar5;
      }
      else {
        stb__match(stb__dout +
                   -(ulong)(((uint)*(byte *)((long)puVar8 + 1) + (uint)bVar1 * 0x100) - 0x3fff),
                   (byte)puVar8[1] + 1);
        puVar6 = (ushort *)((long)puVar8 + 3);
      }
    } while ((puVar6 != puVar8) &&
            (puVar8 = puVar6,
            stb__dout <=
            puVar3 + (uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                     uVar2 << 0x18)));
  }
  if (font_cfg_template == (ImFontConfig *)0x0) {
    local_d0.MergeMode = false;
    local_d0._73_3_ = 0;
    local_d0.FontBuilderFlags = 0;
    local_160._0_3_ = 0;
    local_160._3_4_ = 0;
    fStack_159 = 0.0;
    local_138._0_1_ = false;
    local_138._1_3_ = 0;
    local_138._4_4_ = 0.0;
    uStack_130._0_4_ = 0.0;
    uStack_130._4_4_ = 0.0;
    local_128._0_4_ = 0.0;
    local_128._4_4_ = 0;
    pIStack_120 = (ImWchar *)0x0;
    local_118 = 0.0;
    local_108[0] = '\0';
    local_108[1] = '\0';
    local_108[2] = '\0';
    local_108[3] = '\0';
    local_108[4] = '\0';
    local_108[5] = '\0';
    local_108[6] = '\0';
    local_108[7] = '\0';
    local_108[8] = '\0';
    local_108[9] = '\0';
    local_108[10] = '\0';
    local_108[0xb] = '\0';
    local_108[0xc] = '\0';
    local_108[0xd] = '\0';
    local_108[0xe] = '\0';
    local_108[0xf] = '\0';
    local_108[0x10] = '\0';
    local_108[0x11] = '\0';
    local_108[0x12] = '\0';
    local_108[0x13] = '\0';
    local_108[0x14] = '\0';
    local_108[0x15] = '\0';
    local_108[0x16] = '\0';
    local_108[0x17] = '\0';
    local_108[0x18] = '\0';
    local_108[0x19] = '\0';
    local_108[0x1a] = '\0';
    local_108[0x1b] = '\0';
    local_108[0x1c] = '\0';
    local_108[0x1d] = '\0';
    local_108[0x1e] = '\0';
    local_108[0x1f] = '\0';
    local_108[0x20] = '\0';
    local_108[0x21] = '\0';
    local_108[0x22] = '\0';
    local_108[0x23] = '\0';
    local_108[0x24] = '\0';
    local_108[0x25] = '\0';
    local_108[0x26] = '\0';
    local_108[0x27] = '\0';
    local_108._40_8_ = 0;
    local_d8 = 0;
    local_d0.OversampleH = 3;
    local_d0.OversampleV = 1;
    local_d0.EllipsisChar = 0xffff;
    local_d0.RasterizerMultiply = 1.0;
    local_d0.GlyphMaxAdvanceX = 3.4028235e+38;
  }
  else {
    local_160 = (undefined7)*(undefined8 *)&font_cfg_template->field_0xd;
    fStack_159 = font_cfg_template->SizePixels;
    local_d0.OversampleH = font_cfg_template->OversampleH;
    local_d0.OversampleV = font_cfg_template->OversampleV;
    local_138._0_1_ = font_cfg_template->PixelSnapH;
    local_138._1_3_ = *(undefined3 *)&font_cfg_template->field_0x21;
    local_138._4_4_ = (font_cfg_template->GlyphExtraSpacing).x;
    uStack_130 = *(undefined8 *)&(font_cfg_template->GlyphExtraSpacing).y;
    local_128 = *(undefined8 *)&(font_cfg_template->GlyphOffset).y;
    pIStack_120 = font_cfg_template->GlyphRanges;
    local_118 = font_cfg_template->GlyphMinAdvanceX;
    local_d0.GlyphMaxAdvanceX = font_cfg_template->GlyphMaxAdvanceX;
    local_d0.MergeMode = font_cfg_template->MergeMode;
    local_d0._73_3_ = *(undefined3 *)&font_cfg_template->field_0x49;
    local_d0.FontBuilderFlags = font_cfg_template->FontBuilderFlags;
    local_d0.RasterizerMultiply = font_cfg_template->RasterizerMultiply;
    local_d0.EllipsisChar = font_cfg_template->EllipsisChar;
    local_d8 = *(undefined2 *)((long)&font_cfg_template->DstFont + 6);
    local_108._32_8_ = *(undefined8 *)(font_cfg_template->Name + 0x20);
    local_108._40_8_ = *(undefined8 *)&font_cfg_template->field_0x7e;
    local_108._16_8_ = *(undefined8 *)(font_cfg_template->Name + 0x10);
    local_108._24_8_ = *(undefined8 *)(font_cfg_template->Name + 0x18);
    local_108._0_8_ = *(undefined8 *)font_cfg_template->Name;
    local_108._8_8_ = *(undefined8 *)(font_cfg_template->Name + 8);
  }
  local_d0.FontDataOwnedByAtlas = true;
  local_d0._13_3_ = (undefined3)local_160;
  local_d0.FontNo = local_160._3_4_;
  local_d0.PixelSnapH = local_138._0_1_;
  local_d0._33_3_ = local_138._1_3_;
  local_d0.GlyphExtraSpacing.x = local_138._4_4_;
  local_d0.GlyphExtraSpacing.y = (float)uStack_130;
  local_d0.GlyphOffset.x = uStack_130._4_4_;
  local_d0.GlyphOffset.y = (float)local_128;
  local_d0._52_4_ = local_128._4_4_;
  local_d0.GlyphRanges = pIStack_120;
  local_d0.GlyphMinAdvanceX = local_118;
  local_d0.DstFont._6_2_ = local_d8;
  local_d0.Name[0x20] = local_108[0x20];
  local_d0.Name[0x21] = local_108[0x21];
  local_d0.Name[0x22] = local_108[0x22];
  local_d0.Name[0x23] = local_108[0x23];
  local_d0.Name[0x24] = local_108[0x24];
  local_d0.Name[0x25] = local_108[0x25];
  local_d0.Name[0x26] = local_108[0x26];
  local_d0.Name[0x27] = local_108[0x27];
  local_d0._126_8_ = local_108._40_8_;
  local_d0.Name[0x10] = local_108[0x10];
  local_d0.Name[0x11] = local_108[0x11];
  local_d0.Name[0x12] = local_108[0x12];
  local_d0.Name[0x13] = local_108[0x13];
  local_d0.Name[0x14] = local_108[0x14];
  local_d0.Name[0x15] = local_108[0x15];
  local_d0.Name[0x16] = local_108[0x16];
  local_d0.Name[0x17] = local_108[0x17];
  local_d0.Name[0x18] = local_108[0x18];
  local_d0.Name[0x19] = local_108[0x19];
  local_d0.Name[0x1a] = local_108[0x1a];
  local_d0.Name[0x1b] = local_108[0x1b];
  local_d0.Name[0x1c] = local_108[0x1c];
  local_d0.Name[0x1d] = local_108[0x1d];
  local_d0.Name[0x1e] = local_108[0x1e];
  local_d0.Name[0x1f] = local_108[0x1f];
  local_d0.Name[0] = local_108[0];
  local_d0.Name[1] = local_108[1];
  local_d0.Name[2] = local_108[2];
  local_d0.Name[3] = local_108[3];
  local_d0.Name[4] = local_108[4];
  local_d0.Name[5] = local_108[5];
  local_d0.Name[6] = local_108[6];
  local_d0.Name[7] = local_108[7];
  local_d0.Name[8] = local_108[8];
  local_d0.Name[9] = local_108[9];
  local_d0.Name[10] = local_108[10];
  local_d0.Name[0xb] = local_108[0xb];
  local_d0.Name[0xc] = local_108[0xc];
  local_d0.Name[0xd] = local_108[0xd];
  local_d0.Name[0xe] = local_108[0xe];
  local_d0.Name[0xf] = local_108[0xf];
  local_d0.SizePixels =
       (float)(~-(uint)(0.0 < local_48) & (uint)fStack_159 |
              (uint)local_48 & -(uint)(0.0 < local_48));
  if (glyph_ranges != (ImWchar *)0x0) {
    local_d0.GlyphRanges = glyph_ranges;
  }
  local_d0.FontData = puVar3;
  local_d0.FontDataSize = uVar10;
  pIVar4 = AddFont(this,&local_d0);
  return pIVar4;
}

Assistant:

ImFont* ImFontAtlas::AddFontFromMemoryCompressedTTF(const void* compressed_ttf_data, int compressed_ttf_size, float size_pixels, const ImFontConfig* font_cfg_template, const ImWchar* glyph_ranges)
{
    const unsigned int buf_decompressed_size = stb_decompress_length((const unsigned char*)compressed_ttf_data);
    unsigned char* buf_decompressed_data = (unsigned char*)IM_ALLOC(buf_decompressed_size);
    stb_decompress(buf_decompressed_data, (const unsigned char*)compressed_ttf_data, (unsigned int)compressed_ttf_size);

    ImFontConfig font_cfg = font_cfg_template ? *font_cfg_template : ImFontConfig();
    IM_ASSERT(font_cfg.FontData == NULL);
    font_cfg.FontDataOwnedByAtlas = true;
    return AddFontFromMemoryTTF(buf_decompressed_data, (int)buf_decompressed_size, size_pixels, &font_cfg, glyph_ranges);
}